

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *r,NormalTextureInfo *prop,
               aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  bool bVar1;
  Texture *pTVar2;
  uint texSlot_local;
  aiTextureType texType_local;
  aiMaterial *mat_local;
  NormalTextureInfo *prop_local;
  Asset *r_local;
  vector<int,_std::allocator<int>_> *embeddedTexIdxs_local;
  
  SetMaterialTextureProperty(embeddedTexIdxs,r,prop->super_TextureInfo,mat,texType,texSlot);
  bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)prop);
  if (bVar1) {
    pTVar2 = glTF2::Ref<glTF2::Texture>::operator->((Ref<glTF2::Texture> *)prop);
    bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)&pTVar2->source);
    if (bVar1) {
      aiMaterial::AddProperty(mat,&prop->scale,1,"$tex.scale",texType,texSlot);
    }
  }
  return;
}

Assistant:

inline void SetMaterialTextureProperty(std::vector<int>& embeddedTexIdxs, Asset& r, glTF2::NormalTextureInfo& prop, aiMaterial* mat, aiTextureType texType, unsigned int texSlot = 0)
{
    SetMaterialTextureProperty( embeddedTexIdxs, r, (glTF2::TextureInfo) prop, mat, texType, texSlot );

    if (prop.texture && prop.texture->source) {
         mat->AddProperty(&prop.scale, 1, AI_MATKEY_GLTF_TEXTURE_SCALE(texType, texSlot));
    }
}